

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.hpp
# Opt level: O0

int actorpp::connect(int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  int iVar2;
  char *__name;
  char *__service;
  runtime_error *prVar3;
  int sockfd;
  undefined1 local_70 [4];
  int err;
  string port_str;
  addrinfo *res;
  addrinfo hints;
  int port_local;
  string *hostname_local;
  
  hints.ai_next._4_4_ = (int)__addr;
  hints.ai_addr = (sockaddr *)0x0;
  hints.ai_canonname = (char *)0x0;
  hints.ai_socktype = 0;
  hints.ai_protocol = 0;
  hints.ai_addrlen = 0;
  hints._20_4_ = 0;
  res = (addrinfo *)0x200000000;
  hints.ai_flags = 1;
  hints.ai_family = 0;
  std::__cxx11::to_string((string *)local_70,hints.ai_next._4_4_);
  __name = (char *)std::__cxx11::string::c_str();
  __service = (char *)std::__cxx11::string::c_str();
  iVar1 = getaddrinfo(__name,__service,(addrinfo *)&res,(addrinfo **)((long)&port_str.field_2 + 8));
  if ((iVar1 != 0) || (port_str.field_2._8_8_ == 0)) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"dns lookup failed");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = socket(*(int *)(port_str.field_2._8_8_ + 4),*(int *)(port_str.field_2._8_8_ + 8),0);
  if (iVar1 < 0) {
    freeaddrinfo((addrinfo *)port_str.field_2._8_8_);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"failed to allocate socket");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = ::connect(iVar1,*(sockaddr **)(port_str.field_2._8_8_ + 0x18),
                    *(socklen_t *)(port_str.field_2._8_8_ + 0x10));
  if (iVar2 != 0) {
    close(iVar1);
    freeaddrinfo((addrinfo *)port_str.field_2._8_8_);
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"failed to connect");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  freeaddrinfo((addrinfo *)port_str.field_2._8_8_);
  std::__cxx11::string::~string((string *)local_70);
  return iVar1;
}

Assistant:

int connect(const std::string &hostname, int port) {
  struct addrinfo hints;
  memset(&hints, 0, sizeof(hints));
  hints.ai_family = AF_INET;
  hints.ai_socktype = SOCK_STREAM;
  struct addrinfo *res;

  std::string port_str = std::to_string(port);
  int err = getaddrinfo(hostname.c_str(), port_str.c_str(), &hints, &res);

  if (err != 0 || res == NULL) {
    throw std::runtime_error("dns lookup failed");
  }

  int sockfd = socket(res->ai_family, res->ai_socktype, 0);
  if (sockfd < 0) {
    freeaddrinfo(res);
    throw std::runtime_error("failed to allocate socket");
  }

  if (connect(sockfd, res->ai_addr, res->ai_addrlen) != 0) {
    close(sockfd);
    freeaddrinfo(res);
    throw std::runtime_error("failed to connect");
  }

  freeaddrinfo(res);

  return sockfd;
}